

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::debug_process_summaryfile(aalcalc *this,string *filename)

{
  uint *puVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  mapped_type *pmVar4;
  double dVar5;
  int summary_set;
  sampleslevelRec sr;
  summarySampleslevelHeader sh;
  int summarycalcstream_type;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL:%s: cannot open %s\n","debug_process_summaryfile",
            (filename->_M_dataplus)._M_p);
    iVar2 = 1;
  }
  else {
    summarycalcstream_type = 0;
    fread(&summarycalcstream_type,4,1,__stream);
    if ((summarycalcstream_type & 0x3000000U) == 0x3000000) {
      if ((summarycalcstream_type & 0xffffffU) == 1) {
        summary_set = 0;
        sVar3 = fread(&this->samplesize_,4,1,__stream);
        if (sVar3 == 0) {
          sVar3 = 0;
        }
        else {
          sVar3 = fread(&summary_set,4,1,__stream);
        }
        puts("event_id,period_no,summary_id,sidx,loss");
LAB_00103ab3:
        if (sVar3 != 0) {
          sVar3 = fread(&sh,0xc,1,__stream);
          while (sVar3 != 0) {
            sVar3 = fread(&sr,8,1,__stream);
            iVar2 = sr.sidx;
            if ((sVar3 == 0) || (sr.sidx == 0)) goto LAB_00103ab3;
            pmVar4 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[](&this->event_to_period_,&sh.event_id);
            puVar1 = (uint *)(pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start;
            dVar5 = (double)sr.loss;
            while (pmVar4 = std::
                            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                            ::operator[](&this->event_to_period_,&sh.event_id),
                  puVar1 != (uint *)(pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish) {
              printf("%d,%d,%d,%d,%f\n",dVar5,(ulong)(uint)sh.event_id,(ulong)*puVar1,
                     (ulong)(uint)sh.summary_id,(ulong)(uint)iVar2);
            }
          }
          sVar3 = 0;
          goto LAB_00103ab3;
        }
      }
      fclose(__stream);
      return;
    }
    fprintf(_stderr,"FATAL:%s: Not a summarycalc stream type %d\n","debug_process_summaryfile");
    iVar2 = -1;
  }
  exit(iVar2);
}

Assistant:

void aalcalc::debug_process_summaryfile(const std::string &filename)
{
	FILE *fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		fprintf(stderr, "FATAL:%s: Not a summarycalc stream type %d\n", __func__, stream_type);
		exit(-1);
	}
	stream_type = streamno_mask & summarycalcstream_type;

	if (stream_type == 1) {
		int summary_set = 0;
		i = fread(&samplesize_, sizeof(samplesize_), 1, fin);
		if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
		printf("event_id,period_no,summary_id,sidx,loss\n");
		summarySampleslevelHeader sh;
		int j = 0;
		while (i != 0) {
			i = fread(&sh, sizeof(sh), 1, fin);
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, fin);
				if (i == 0) break;
				if (sr.sidx == 0) break;
				auto p_iter = event_to_period_[sh.event_id].begin();
				while (p_iter != event_to_period_[sh.event_id].end()) {
					printf("%d,%d,%d,%d,%f\n", sh.event_id, *p_iter, sh.summary_id, sr.sidx, sr.loss);
				}

			}
			j++;
		}		
	}

	fclose(fin);
}